

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  byte bVar9;
  undefined1 auVar10 [32];
  bool bVar11;
  int iVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar67 [64];
  uint uVar72;
  uint uVar73;
  uint uVar74;
  undefined1 auVar71 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  RTCFilterFunctionNArguments local_15b0;
  undefined1 local_1580 [32];
  undefined1 local_1560 [16];
  undefined1 local_1550 [16];
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14b0 [16];
  float local_14a0 [4];
  undefined1 local_1490 [16];
  float local_1480 [4];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  uint local_1260;
  uint uStack_125c;
  uint uStack_1258;
  uint uStack_1254;
  uint uStack_1250;
  uint uStack_124c;
  uint uStack_1248;
  uint uStack_1244;
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  puVar26 = local_11f8;
  local_1200 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1340._4_4_ = fVar2;
  local_1340._0_4_ = fVar2;
  local_1340._8_4_ = fVar2;
  local_1340._12_4_ = fVar2;
  local_1340._16_4_ = fVar2;
  local_1340._20_4_ = fVar2;
  local_1340._24_4_ = fVar2;
  local_1340._28_4_ = fVar2;
  auVar53 = ZEXT3264(local_1340);
  fVar63 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = fVar63;
  local_1360._0_4_ = fVar63;
  local_1360._8_4_ = fVar63;
  local_1360._12_4_ = fVar63;
  local_1360._16_4_ = fVar63;
  local_1360._20_4_ = fVar63;
  local_1360._24_4_ = fVar63;
  local_1360._28_4_ = fVar63;
  auVar57 = ZEXT3264(local_1360);
  fVar68 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1380._4_4_ = fVar68;
  local_1380._0_4_ = fVar68;
  local_1380._8_4_ = fVar68;
  local_1380._12_4_ = fVar68;
  local_1380._16_4_ = fVar68;
  local_1380._20_4_ = fVar68;
  local_1380._24_4_ = fVar68;
  local_1380._28_4_ = fVar68;
  auVar58 = ZEXT3264(local_1380);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar63 = fVar63 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar68 = fVar68 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_13a0._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_13a0._8_4_ = -fVar2;
  local_13a0._12_4_ = -fVar2;
  local_13a0._16_4_ = -fVar2;
  local_13a0._20_4_ = -fVar2;
  local_13a0._24_4_ = -fVar2;
  local_13a0._28_4_ = -fVar2;
  auVar62 = ZEXT3264(local_13a0);
  local_13c0._0_8_ = CONCAT44(fVar63,fVar63) ^ 0x8000000080000000;
  local_13c0._8_4_ = -fVar63;
  local_13c0._12_4_ = -fVar63;
  local_13c0._16_4_ = -fVar63;
  local_13c0._20_4_ = -fVar63;
  local_13c0._24_4_ = -fVar63;
  local_13c0._28_4_ = -fVar63;
  auVar67 = ZEXT3264(local_13c0);
  local_13e0._0_8_ = CONCAT44(fVar68,fVar68) ^ 0x8000000080000000;
  local_13e0._8_4_ = -fVar68;
  local_13e0._12_4_ = -fVar68;
  local_13e0._16_4_ = -fVar68;
  local_13e0._20_4_ = -fVar68;
  local_13e0._24_4_ = -fVar68;
  local_13e0._28_4_ = -fVar68;
  auVar71 = ZEXT3264(local_13e0);
  iVar12 = (tray->tnear).field_0.i[k];
  local_1400._4_4_ = iVar12;
  local_1400._0_4_ = iVar12;
  local_1400._8_4_ = iVar12;
  local_1400._12_4_ = iVar12;
  local_1400._16_4_ = iVar12;
  local_1400._20_4_ = iVar12;
  local_1400._24_4_ = iVar12;
  local_1400._28_4_ = iVar12;
  auVar77 = ZEXT3264(local_1400);
  iVar12 = (tray->tfar).field_0.i[k];
  local_1420._4_4_ = iVar12;
  local_1420._0_4_ = iVar12;
  local_1420._8_4_ = iVar12;
  local_1420._12_4_ = iVar12;
  local_1420._16_4_ = iVar12;
  local_1420._20_4_ = iVar12;
  local_1420._24_4_ = iVar12;
  local_1420._28_4_ = iVar12;
  auVar79 = ZEXT3264(local_1420);
  iVar12 = 1 << ((uint)k & 0x1f);
  auVar41._4_4_ = iVar12;
  auVar41._0_4_ = iVar12;
  auVar41._8_4_ = iVar12;
  auVar41._12_4_ = iVar12;
  auVar41._16_4_ = iVar12;
  auVar41._20_4_ = iVar12;
  auVar41._24_4_ = iVar12;
  auVar41._28_4_ = iVar12;
  auVar10 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar41 = vpand_avx2(auVar41,auVar10);
  local_1440 = vpcmpeqd_avx2(auVar41,auVar10);
  bVar11 = true;
  do {
    uVar33 = puVar26[-1];
    puVar26 = puVar26 + -1;
    while ((uVar33 & 8) == 0) {
      uVar13 = uVar33 & 0xfffffffffffffff0;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar42._4_4_ = uVar3;
      auVar42._0_4_ = uVar3;
      auVar42._8_4_ = uVar3;
      auVar42._12_4_ = uVar3;
      auVar42._16_4_ = uVar3;
      auVar42._20_4_ = uVar3;
      auVar42._24_4_ = uVar3;
      auVar42._28_4_ = uVar3;
      auVar35 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar29),auVar42,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar29));
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar53._0_32_,auVar62._0_32_);
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar31),auVar42,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar31));
      auVar40 = vfmadd213ps_fma(ZEXT1632(auVar40),auVar57._0_32_,auVar67._0_32_);
      auVar41 = vpmaxsd_avx2(ZEXT1632(auVar35),ZEXT1632(auVar40));
      auVar35 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar22),auVar42,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar22));
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar58._0_32_,auVar71._0_32_);
      auVar10 = vpmaxsd_avx2(ZEXT1632(auVar35),auVar77._0_32_);
      auVar35 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + (uVar29 ^ 0x20)),auVar42,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + (uVar29 ^ 0x20)));
      auVar41 = vpmaxsd_avx2(auVar41,auVar10);
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + (uVar31 ^ 0x20)),auVar42,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + (uVar31 ^ 0x20)));
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar53._0_32_,auVar62._0_32_);
      auVar40 = vfmadd213ps_fma(ZEXT1632(auVar40),auVar57._0_32_,auVar67._0_32_);
      auVar10 = vpminsd_avx2(ZEXT1632(auVar35),ZEXT1632(auVar40));
      auVar35 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + (uVar22 ^ 0x20)),auVar42,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + (uVar22 ^ 0x20)));
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar58._0_32_,auVar71._0_32_);
      auVar48 = vpminsd_avx2(ZEXT1632(auVar35),auVar79._0_32_);
      auVar10 = vpminsd_avx2(auVar10,auVar48);
      auVar41 = vcmpps_avx(auVar41,auVar10,2);
      if (((uint)uVar33 & 7) == 6) {
        auVar10 = vcmpps_avx(*(undefined1 (*) [32])(uVar13 + 0x1c0),auVar42,2);
        auVar48 = vcmpps_avx(auVar42,*(undefined1 (*) [32])(uVar13 + 0x1e0),1);
        auVar10 = vandps_avx(auVar10,auVar48);
        auVar41 = vandps_avx(auVar10,auVar41);
        auVar35 = vpackssdw_avx(auVar41._0_16_,auVar41._16_16_);
      }
      else {
        auVar35 = vpackssdw_avx(auVar41._0_16_,auVar41._16_16_);
      }
      auVar35 = vpsllw_avx(auVar35,0xf);
      if ((((((((auVar35 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar35 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar35 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar35 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar35 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar35[0xf])
      goto joined_r0x0062b7ae;
      auVar35 = vpacksswb_avx(auVar35,auVar35);
      bVar9 = SUB161(auVar35 >> 7,0) & 1 | (SUB161(auVar35 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar35 >> 0x17,0) & 1) << 2 | (SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar35 >> 0x27,0) & 1) << 4 | (SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar35 >> 0x37,0) & 1) << 6 | SUB161(auVar35 >> 0x3f,0) << 7;
      lVar21 = 0;
      for (uVar33 = (ulong)bVar9; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar33 = *(ulong *)(uVar13 + lVar21 * 8);
      uVar25 = bVar9 - 1 & (uint)bVar9;
      uVar23 = (ulong)uVar25;
      if (uVar25 != 0) {
        *puVar26 = uVar33;
        lVar21 = 0;
        for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
          lVar21 = lVar21 + 1;
        }
        uVar25 = uVar25 - 1 & uVar25;
        uVar23 = (ulong)uVar25;
        bVar34 = uVar25 == 0;
        while( true ) {
          puVar26 = puVar26 + 1;
          uVar33 = *(ulong *)(uVar13 + lVar21 * 8);
          if (bVar34) break;
          *puVar26 = uVar33;
          lVar21 = 0;
          for (uVar33 = uVar23; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
            lVar21 = lVar21 + 1;
          }
          uVar23 = uVar23 - 1 & uVar23;
          bVar34 = uVar23 == 0;
        }
      }
    }
    uVar13 = (ulong)((uint)uVar33 & 0xf);
    if (uVar13 != 8) {
      uVar33 = uVar33 & 0xfffffffffffffff0;
      lVar21 = 0;
      do {
        lVar20 = lVar21 * 0x50;
        pSVar5 = context->scene;
        pGVar6 = (pSVar5->geometries).items[*(uint *)(uVar33 + 0x30 + lVar20)].ptr;
        fVar2 = (pGVar6->time_range).lower;
        fVar2 = pGVar6->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar2) / ((pGVar6->time_range).upper - fVar2));
        auVar35 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
        auVar35 = vminss_avx(auVar35,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
        auVar47 = vmaxss_avx(ZEXT816(0),auVar35);
        lVar14 = (long)(int)auVar47._0_4_ * 0x38;
        uVar32 = (ulong)*(uint *)(uVar33 + 4 + lVar20);
        lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar14);
        lVar14 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar14);
        auVar35 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar33 + lVar20) * 4);
        uVar24 = (ulong)*(uint *)(uVar33 + 0x10 + lVar20);
        auVar40 = *(undefined1 (*) [16])(lVar7 + uVar24 * 4);
        uVar23 = (ulong)*(uint *)(uVar33 + 0x20 + lVar20);
        auVar46 = *(undefined1 (*) [16])(lVar7 + uVar23 * 4);
        auVar36 = *(undefined1 (*) [16])(lVar7 + uVar32 * 4);
        uVar15 = (ulong)*(uint *)(uVar33 + 0x14 + lVar20);
        auVar66 = *(undefined1 (*) [16])(lVar7 + uVar15 * 4);
        uVar16 = (ulong)*(uint *)(uVar33 + 0x24 + lVar20);
        auVar50 = *(undefined1 (*) [16])(lVar7 + uVar16 * 4);
        uVar30 = (ulong)*(uint *)(uVar33 + 8 + lVar20);
        auVar43 = *(undefined1 (*) [16])(lVar7 + uVar30 * 4);
        uVar17 = (ulong)*(uint *)(uVar33 + 0x18 + lVar20);
        auVar60 = *(undefined1 (*) [16])(lVar7 + uVar17 * 4);
        uVar27 = (ulong)*(uint *)(uVar33 + 0x28 + lVar20);
        auVar44 = *(undefined1 (*) [16])(lVar7 + uVar27 * 4);
        uVar28 = (ulong)*(uint *)(uVar33 + 0xc + lVar20);
        auVar52 = *(undefined1 (*) [16])(lVar7 + uVar28 * 4);
        uVar18 = (ulong)*(uint *)(uVar33 + 0x1c + lVar20);
        auVar37 = *(undefined1 (*) [16])(lVar7 + uVar18 * 4);
        uVar19 = (ulong)*(uint *)(uVar33 + 0x2c + lVar20);
        auVar38 = *(undefined1 (*) [16])(lVar7 + uVar19 * 4);
        auVar39 = *(undefined1 (*) [16])(lVar14 + (ulong)*(uint *)(uVar33 + lVar20) * 4);
        auVar54 = *(undefined1 (*) [16])(lVar14 + uVar24 * 4);
        fVar2 = fVar2 - auVar47._0_4_;
        auVar47 = vunpcklps_avx(auVar35,auVar43);
        auVar43 = vunpckhps_avx(auVar35,auVar43);
        auVar49 = vunpcklps_avx(auVar36,auVar52);
        auVar36 = vunpckhps_avx(auVar36,auVar52);
        auVar35 = *(undefined1 (*) [16])(lVar14 + uVar32 * 4);
        local_1550 = vunpcklps_avx(auVar43,auVar36);
        auVar52 = vunpcklps_avx(auVar47,auVar49);
        auVar43 = vunpckhps_avx(auVar47,auVar49);
        auVar47 = vunpcklps_avx(auVar40,auVar60);
        auVar36 = vunpckhps_avx(auVar40,auVar60);
        auVar60 = vunpcklps_avx(auVar66,auVar37);
        auVar66 = vunpckhps_avx(auVar66,auVar37);
        auVar40 = *(undefined1 (*) [16])(lVar14 + uVar30 * 4);
        local_1540 = vunpcklps_avx(auVar36,auVar66);
        auVar37 = vunpcklps_avx(auVar47,auVar60);
        local_1560 = vunpckhps_avx(auVar47,auVar60);
        auVar47 = vunpcklps_avx(auVar46,auVar44);
        auVar66 = vunpckhps_avx(auVar46,auVar44);
        auVar44 = vunpcklps_avx(auVar50,auVar38);
        auVar60 = vunpckhps_avx(auVar50,auVar38);
        auVar36 = *(undefined1 (*) [16])(lVar14 + uVar28 * 4);
        auVar38 = vunpcklps_avx(auVar66,auVar60);
        auVar49 = vunpcklps_avx(auVar47,auVar44);
        local_1530 = vunpckhps_avx(auVar47,auVar44);
        auVar66 = vunpcklps_avx(auVar39,auVar40);
        auVar40 = vunpckhps_avx(auVar39,auVar40);
        auVar60 = vunpcklps_avx(auVar35,auVar36);
        auVar36 = vunpckhps_avx(auVar35,auVar36);
        auVar35 = *(undefined1 (*) [16])(lVar14 + uVar17 * 4);
        auVar44 = vunpcklps_avx(auVar40,auVar36);
        auVar39 = vunpcklps_avx(auVar66,auVar60);
        auVar36 = vunpckhps_avx(auVar66,auVar60);
        auVar60 = vunpcklps_avx(auVar54,auVar35);
        auVar66 = vunpckhps_avx(auVar54,auVar35);
        auVar35 = *(undefined1 (*) [16])(lVar14 + uVar15 * 4);
        auVar40 = *(undefined1 (*) [16])(lVar14 + uVar18 * 4);
        auVar54 = vunpcklps_avx(auVar35,auVar40);
        auVar35 = vunpckhps_avx(auVar35,auVar40);
        auVar47 = vunpcklps_avx(auVar66,auVar35);
        auVar46 = vunpcklps_avx(auVar60,auVar54);
        auVar66 = vunpckhps_avx(auVar60,auVar54);
        auVar35 = *(undefined1 (*) [16])(lVar14 + uVar23 * 4);
        auVar40 = *(undefined1 (*) [16])(lVar14 + uVar27 * 4);
        auVar54 = vunpcklps_avx(auVar35,auVar40);
        auVar60 = vunpckhps_avx(auVar35,auVar40);
        auVar35 = *(undefined1 (*) [16])(lVar14 + uVar16 * 4);
        auVar40 = *(undefined1 (*) [16])(lVar14 + uVar19 * 4);
        auVar50 = vunpcklps_avx(auVar35,auVar40);
        auVar35 = vunpckhps_avx(auVar35,auVar40);
        auVar40 = vunpcklps_avx(auVar60,auVar35);
        auVar60 = vunpcklps_avx(auVar54,auVar50);
        auVar35 = vunpckhps_avx(auVar54,auVar50);
        fVar63 = 1.0 - fVar2;
        auVar80._4_4_ = fVar63;
        auVar80._0_4_ = fVar63;
        auVar80._8_4_ = fVar63;
        auVar80._12_4_ = fVar63;
        auVar54._0_4_ = fVar2 * auVar39._0_4_;
        auVar54._4_4_ = fVar2 * auVar39._4_4_;
        auVar54._8_4_ = fVar2 * auVar39._8_4_;
        auVar54._12_4_ = fVar2 * auVar39._12_4_;
        auVar52 = vfmadd231ps_fma(auVar54,auVar80,auVar52);
        auVar59._0_4_ = fVar2 * auVar36._0_4_;
        auVar59._4_4_ = fVar2 * auVar36._4_4_;
        auVar59._8_4_ = fVar2 * auVar36._8_4_;
        auVar59._12_4_ = fVar2 * auVar36._12_4_;
        auVar39 = vfmadd231ps_fma(auVar59,auVar80,auVar43);
        auVar64._0_4_ = fVar2 * auVar44._0_4_;
        auVar64._4_4_ = fVar2 * auVar44._4_4_;
        auVar64._8_4_ = fVar2 * auVar44._8_4_;
        auVar64._12_4_ = fVar2 * auVar44._12_4_;
        auVar54 = vfmadd231ps_fma(auVar64,auVar80,local_1550);
        auVar36._0_4_ = fVar2 * auVar46._0_4_;
        auVar36._4_4_ = fVar2 * auVar46._4_4_;
        auVar36._8_4_ = fVar2 * auVar46._8_4_;
        auVar36._12_4_ = fVar2 * auVar46._12_4_;
        auVar36 = vfmadd231ps_fma(auVar36,auVar80,auVar37);
        auVar43._0_4_ = fVar2 * auVar66._0_4_;
        auVar43._4_4_ = fVar2 * auVar66._4_4_;
        auVar43._8_4_ = fVar2 * auVar66._8_4_;
        auVar43._12_4_ = fVar2 * auVar66._12_4_;
        auVar66 = vfmadd231ps_fma(auVar43,auVar80,local_1560);
        auVar46._0_4_ = fVar2 * auVar47._0_4_;
        auVar46._4_4_ = fVar2 * auVar47._4_4_;
        auVar46._8_4_ = fVar2 * auVar47._8_4_;
        auVar46._12_4_ = fVar2 * auVar47._12_4_;
        auVar43 = vfmadd231ps_fma(auVar46,auVar80,local_1540);
        puVar1 = (undefined8 *)(uVar33 + 0x30 + lVar20);
        local_1510 = *puVar1;
        uStack_1508 = puVar1[1];
        puVar1 = (undefined8 *)(uVar33 + 0x40 + lVar20);
        auVar50._0_4_ = fVar2 * auVar60._0_4_;
        auVar50._4_4_ = fVar2 * auVar60._4_4_;
        auVar50._8_4_ = fVar2 * auVar60._8_4_;
        auVar50._12_4_ = fVar2 * auVar60._12_4_;
        auVar75._0_4_ = fVar2 * auVar35._0_4_;
        auVar75._4_4_ = fVar2 * auVar35._4_4_;
        auVar75._8_4_ = fVar2 * auVar35._8_4_;
        auVar75._12_4_ = fVar2 * auVar35._12_4_;
        auVar82._0_4_ = fVar2 * auVar40._0_4_;
        auVar82._4_4_ = fVar2 * auVar40._4_4_;
        auVar82._8_4_ = fVar2 * auVar40._8_4_;
        auVar82._12_4_ = fVar2 * auVar40._12_4_;
        auVar60 = vfmadd231ps_fma(auVar50,auVar80,auVar49);
        auVar44 = vfmadd231ps_fma(auVar75,auVar80,local_1530);
        auVar37 = vfmadd231ps_fma(auVar82,auVar80,auVar38);
        local_1520 = *puVar1;
        uStack_1518 = puVar1[1];
        auVar40 = vsubps_avx(auVar52,auVar36);
        auVar35 = vsubps_avx(auVar39,auVar66);
        auVar36 = vsubps_avx(auVar54,auVar43);
        auVar66 = vsubps_avx(auVar60,auVar52);
        auVar43 = vsubps_avx(auVar44,auVar39);
        auVar60 = vsubps_avx(auVar37,auVar54);
        auVar44._0_4_ = auVar35._0_4_ * auVar60._0_4_;
        auVar44._4_4_ = auVar35._4_4_ * auVar60._4_4_;
        auVar44._8_4_ = auVar35._8_4_ * auVar60._8_4_;
        auVar44._12_4_ = auVar35._12_4_ * auVar60._12_4_;
        local_1470 = vfmsub231ps_fma(auVar44,auVar43,auVar36);
        auVar49._0_4_ = auVar36._0_4_ * auVar66._0_4_;
        auVar49._4_4_ = auVar36._4_4_ * auVar66._4_4_;
        auVar49._8_4_ = auVar36._8_4_ * auVar66._8_4_;
        auVar49._12_4_ = auVar36._12_4_ * auVar66._12_4_;
        local_1460 = vfmsub231ps_fma(auVar49,auVar60,auVar40);
        uVar3 = *(undefined4 *)(ray + k * 4);
        auVar47._4_4_ = uVar3;
        auVar47._0_4_ = uVar3;
        auVar47._8_4_ = uVar3;
        auVar47._12_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar51._4_4_ = uVar3;
        auVar51._0_4_ = uVar3;
        auVar51._8_4_ = uVar3;
        auVar51._12_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar37._4_4_ = uVar3;
        auVar37._0_4_ = uVar3;
        auVar37._8_4_ = uVar3;
        auVar37._12_4_ = uVar3;
        fVar2 = *(float *)(ray + k * 4 + 0x80);
        auVar81._4_4_ = fVar2;
        auVar81._0_4_ = fVar2;
        auVar81._8_4_ = fVar2;
        auVar81._12_4_ = fVar2;
        auVar44 = vsubps_avx(auVar52,auVar47);
        fVar63 = *(float *)(ray + k * 4 + 0xa0);
        auVar83._4_4_ = fVar63;
        auVar83._0_4_ = fVar63;
        auVar83._8_4_ = fVar63;
        auVar83._12_4_ = fVar63;
        auVar52 = vsubps_avx(auVar39,auVar51);
        fVar68 = *(float *)(ray + k * 4 + 0xc0);
        auVar84._4_4_ = fVar68;
        auVar84._0_4_ = fVar68;
        auVar84._8_4_ = fVar68;
        auVar84._12_4_ = fVar68;
        auVar37 = vsubps_avx(auVar54,auVar37);
        auVar38._0_4_ = fVar2 * auVar52._0_4_;
        auVar38._4_4_ = fVar2 * auVar52._4_4_;
        auVar38._8_4_ = fVar2 * auVar52._8_4_;
        auVar38._12_4_ = fVar2 * auVar52._12_4_;
        auVar38 = vfmsub231ps_fma(auVar38,auVar44,auVar83);
        auVar65._0_4_ = auVar60._0_4_ * auVar38._0_4_;
        auVar65._4_4_ = auVar60._4_4_ * auVar38._4_4_;
        auVar65._8_4_ = auVar60._8_4_ * auVar38._8_4_;
        auVar65._12_4_ = auVar60._12_4_ * auVar38._12_4_;
        auVar39._0_4_ = auVar36._0_4_ * auVar38._0_4_;
        auVar39._4_4_ = auVar36._4_4_ * auVar38._4_4_;
        auVar39._8_4_ = auVar36._8_4_ * auVar38._8_4_;
        auVar39._12_4_ = auVar36._12_4_ * auVar38._12_4_;
        auVar60._0_4_ = fVar68 * auVar44._0_4_;
        auVar60._4_4_ = fVar68 * auVar44._4_4_;
        auVar60._8_4_ = fVar68 * auVar44._8_4_;
        auVar60._12_4_ = fVar68 * auVar44._12_4_;
        auVar60 = vfmsub231ps_fma(auVar60,auVar37,auVar81);
        auVar36 = vfmadd231ps_fma(auVar65,auVar60,auVar43);
        auVar60 = vfmadd231ps_fma(auVar39,auVar35,auVar60);
        auVar61._0_4_ = auVar43._0_4_ * auVar40._0_4_;
        auVar61._4_4_ = auVar43._4_4_ * auVar40._4_4_;
        auVar61._8_4_ = auVar43._8_4_ * auVar40._8_4_;
        auVar61._12_4_ = auVar43._12_4_ * auVar40._12_4_;
        local_1450 = vfmsub231ps_fma(auVar61,auVar66,auVar35);
        auVar76._0_4_ = fVar63 * auVar37._0_4_;
        auVar76._4_4_ = fVar63 * auVar37._4_4_;
        auVar76._8_4_ = fVar63 * auVar37._8_4_;
        auVar76._12_4_ = fVar63 * auVar37._12_4_;
        auVar38 = vfmsub231ps_fma(auVar76,auVar52,auVar84);
        auVar78._0_4_ = fVar68 * local_1450._0_4_;
        auVar78._4_4_ = fVar68 * local_1450._4_4_;
        auVar78._8_4_ = fVar68 * local_1450._8_4_;
        auVar78._12_4_ = fVar68 * local_1450._12_4_;
        auVar35 = vfmadd231ps_fma(auVar78,local_1460,auVar83);
        auVar43 = vfmadd231ps_fma(auVar35,local_1470,auVar81);
        auVar35._8_4_ = 0x80000000;
        auVar35._0_8_ = 0x8000000080000000;
        auVar35._12_4_ = 0x80000000;
        auVar36 = vfmadd231ps_fma(auVar36,auVar38,auVar66);
        auVar35 = vandps_avx(auVar43,auVar35);
        uVar25 = auVar35._0_4_;
        local_1500._0_4_ = (float)(uVar25 ^ auVar36._0_4_);
        uVar72 = auVar35._4_4_;
        local_1500._4_4_ = (float)(uVar72 ^ auVar36._4_4_);
        uVar73 = auVar35._8_4_;
        local_1500._8_4_ = (float)(uVar73 ^ auVar36._8_4_);
        uVar74 = auVar35._12_4_;
        local_1500._12_4_ = (float)(uVar74 ^ auVar36._12_4_);
        auVar35 = vfmadd231ps_fma(auVar60,auVar40,auVar38);
        local_14f0._0_4_ = (float)(uVar25 ^ auVar35._0_4_);
        local_14f0._4_4_ = (float)(uVar72 ^ auVar35._4_4_);
        local_14f0._8_4_ = (float)(uVar73 ^ auVar35._8_4_);
        local_14f0._12_4_ = (float)(uVar74 ^ auVar35._12_4_);
        auVar36 = ZEXT816(0) << 0x20;
        auVar35 = vcmpps_avx(local_1500,auVar36,5);
        auVar40 = vcmpps_avx(local_14f0,auVar36,5);
        auVar35 = vandps_avx(auVar40,auVar35);
        auVar66._8_4_ = 0x7fffffff;
        auVar66._0_8_ = 0x7fffffff7fffffff;
        auVar66._12_4_ = 0x7fffffff;
        local_14d0 = vandps_avx(auVar43,auVar66);
        auVar40 = vcmpps_avx(auVar43,auVar36,4);
        auVar35 = vandps_avx(auVar40,auVar35);
        auVar40._0_4_ = local_1500._0_4_ + local_14f0._0_4_;
        auVar40._4_4_ = local_1500._4_4_ + local_14f0._4_4_;
        auVar40._8_4_ = local_1500._8_4_ + local_14f0._8_4_;
        auVar40._12_4_ = local_1500._12_4_ + local_14f0._12_4_;
        auVar40 = vcmpps_avx(auVar40,local_14d0,2);
        auVar36 = auVar40 & auVar35;
        if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar36[0xf] < '\0') {
          auVar35 = vandps_avx(auVar35,auVar40);
          auVar55._0_4_ = local_1450._0_4_ * auVar37._0_4_;
          auVar55._4_4_ = local_1450._4_4_ * auVar37._4_4_;
          auVar55._8_4_ = local_1450._8_4_ * auVar37._8_4_;
          auVar55._12_4_ = local_1450._12_4_ * auVar37._12_4_;
          auVar40 = vfmadd213ps_fma(auVar52,local_1460,auVar55);
          auVar40 = vfmadd213ps_fma(auVar44,local_1470,auVar40);
          local_14e0._0_4_ = (float)(uVar25 ^ auVar40._0_4_);
          local_14e0._4_4_ = (float)(uVar72 ^ auVar40._4_4_);
          local_14e0._8_4_ = (float)(uVar73 ^ auVar40._8_4_);
          local_14e0._12_4_ = (float)(uVar74 ^ auVar40._12_4_);
          fVar2 = *(float *)(ray + k * 4 + 0x60);
          auVar52._0_4_ = local_14d0._0_4_ * fVar2;
          auVar52._4_4_ = local_14d0._4_4_ * fVar2;
          auVar52._8_4_ = local_14d0._8_4_ * fVar2;
          auVar52._12_4_ = local_14d0._12_4_ * fVar2;
          auVar40 = vcmpps_avx(auVar52,local_14e0,1);
          fVar2 = *(float *)(ray + k * 4 + 0x100);
          auVar56._0_4_ = local_14d0._0_4_ * fVar2;
          auVar56._4_4_ = local_14d0._4_4_ * fVar2;
          auVar56._8_4_ = local_14d0._8_4_ * fVar2;
          auVar56._12_4_ = local_14d0._12_4_ * fVar2;
          auVar36 = vcmpps_avx(local_14e0,auVar56,2);
          auVar40 = vandps_avx(auVar40,auVar36);
          local_14b0 = vandps_avx(auVar40,auVar35);
          uVar25 = vmovmskps_avx(local_14b0);
          if (uVar25 != 0) {
            auVar35 = vrcpps_avx(local_14d0);
            auVar45._8_4_ = 0x3f800000;
            auVar45._0_8_ = 0x3f8000003f800000;
            auVar45._12_4_ = 0x3f800000;
            auVar40 = vfnmadd213ps_fma(local_14d0,auVar35,auVar45);
            auVar35 = vfmadd132ps_fma(auVar40,auVar35,auVar35);
            fVar63 = auVar35._0_4_;
            fVar68 = auVar35._4_4_;
            fVar69 = auVar35._8_4_;
            fVar70 = auVar35._12_4_;
            local_1480[0] = fVar63 * local_14e0._0_4_;
            local_1480[1] = fVar68 * local_14e0._4_4_;
            local_1480[2] = fVar69 * local_14e0._8_4_;
            local_1480[3] = fVar70 * local_14e0._12_4_;
            local_14a0[0] = fVar63 * local_1500._0_4_;
            local_14a0[1] = fVar68 * local_1500._4_4_;
            local_14a0[2] = fVar69 * local_1500._8_4_;
            local_14a0[3] = fVar70 * local_1500._12_4_;
            local_1490._0_4_ = fVar63 * local_14f0._0_4_;
            local_1490._4_4_ = fVar68 * local_14f0._4_4_;
            local_1490._8_4_ = fVar69 * local_14f0._8_4_;
            local_1490._12_4_ = fVar70 * local_14f0._12_4_;
            uVar23 = (ulong)(uVar25 & 0xff);
            do {
              uVar15 = 0;
              for (uVar16 = uVar23; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                uVar15 = uVar15 + 1;
              }
              local_1260 = *(uint *)((long)&local_1510 + uVar15 * 4);
              pGVar6 = (pSVar5->geometries).items[local_1260].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0062b7d2:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  return bVar11;
                }
                uVar16 = (ulong)(uint)((int)uVar15 * 4);
                uVar3 = *(undefined4 *)((long)local_14a0 + uVar16);
                local_12c0._4_4_ = uVar3;
                local_12c0._0_4_ = uVar3;
                local_12c0._8_4_ = uVar3;
                local_12c0._12_4_ = uVar3;
                local_12c0._16_4_ = uVar3;
                local_12c0._20_4_ = uVar3;
                local_12c0._24_4_ = uVar3;
                local_12c0._28_4_ = uVar3;
                local_12a0 = *(undefined4 *)(local_1490 + uVar16);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_1480 + uVar16);
                local_15b0.context = context->user;
                uVar3 = *(undefined4 *)((long)&local_1520 + uVar16);
                local_1280._4_4_ = uVar3;
                local_1280._0_4_ = uVar3;
                local_1280._8_4_ = uVar3;
                local_1280._12_4_ = uVar3;
                local_1280._16_4_ = uVar3;
                local_1280._20_4_ = uVar3;
                local_1280._24_4_ = uVar3;
                local_1280._28_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1470 + uVar16);
                uVar4 = *(undefined4 *)(local_1460 + uVar16);
                local_1300._4_4_ = uVar4;
                local_1300._0_4_ = uVar4;
                local_1300._8_4_ = uVar4;
                local_1300._12_4_ = uVar4;
                local_1300._16_4_ = uVar4;
                local_1300._20_4_ = uVar4;
                local_1300._24_4_ = uVar4;
                local_1300._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_1450 + uVar16);
                local_12e0._4_4_ = uVar4;
                local_12e0._0_4_ = uVar4;
                local_12e0._8_4_ = uVar4;
                local_12e0._12_4_ = uVar4;
                local_12e0._16_4_ = uVar4;
                local_12e0._20_4_ = uVar4;
                local_12e0._24_4_ = uVar4;
                local_12e0._28_4_ = uVar4;
                local_1320[0] = (RTCHitN)(char)uVar3;
                local_1320[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[4] = (RTCHitN)(char)uVar3;
                local_1320[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[8] = (RTCHitN)(char)uVar3;
                local_1320[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[0xc] = (RTCHitN)(char)uVar3;
                local_1320[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[0x10] = (RTCHitN)(char)uVar3;
                local_1320[0x11] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[0x12] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0x13] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[0x14] = (RTCHitN)(char)uVar3;
                local_1320[0x15] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[0x16] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0x17] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[0x18] = (RTCHitN)(char)uVar3;
                local_1320[0x19] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[0x1a] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0x1b] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1320[0x1c] = (RTCHitN)(char)uVar3;
                local_1320[0x1d] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1320[0x1e] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1320[0x1f] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                uStack_129c = local_12a0;
                uStack_1298 = local_12a0;
                uStack_1294 = local_12a0;
                uStack_1290 = local_12a0;
                uStack_128c = local_12a0;
                uStack_1288 = local_12a0;
                uStack_1284 = local_12a0;
                uStack_125c = local_1260;
                uStack_1258 = local_1260;
                uStack_1254 = local_1260;
                uStack_1250 = local_1260;
                uStack_124c = local_1260;
                uStack_1248 = local_1260;
                uStack_1244 = local_1260;
                vpcmpeqd_avx2(local_12c0,local_12c0);
                uStack_123c = (local_15b0.context)->instID[0];
                local_1240 = uStack_123c;
                uStack_1238 = uStack_123c;
                uStack_1234 = uStack_123c;
                uStack_1230 = uStack_123c;
                uStack_122c = uStack_123c;
                uStack_1228 = uStack_123c;
                uStack_1224 = uStack_123c;
                uStack_121c = (local_15b0.context)->instPrimID[0];
                local_1220 = uStack_121c;
                uStack_1218 = uStack_121c;
                uStack_1214 = uStack_121c;
                uStack_1210 = uStack_121c;
                uStack_120c = uStack_121c;
                uStack_1208 = uStack_121c;
                uStack_1204 = uStack_121c;
                local_1580 = local_1440;
                local_15b0.valid = (int *)local_1580;
                local_15b0.geometryUserPtr = pGVar6->userPtr;
                local_15b0.hit = local_1320;
                local_15b0.N = 8;
                local_15b0.ray = (RTCRayN *)ray;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->occlusionFilterN)(&local_15b0);
                }
                auVar10 = vpcmpeqd_avx2(local_1580,_DAT_01faff00);
                auVar41 = _DAT_01fe9960 & ~auVar10;
                if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar41 >> 0x7f,0) == '\0') &&
                      (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar41 >> 0xbf,0) == '\0') &&
                    (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar41[0x1f]) {
                  auVar10 = auVar10 ^ _DAT_01fe9960;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var8)(&local_15b0);
                  }
                  auVar41 = vpcmpeqd_avx2(local_1580,_DAT_01faff00);
                  auVar10 = auVar41 ^ _DAT_01fe9960;
                  auVar48._8_4_ = 0xff800000;
                  auVar48._0_8_ = 0xff800000ff800000;
                  auVar48._12_4_ = 0xff800000;
                  auVar48._16_4_ = 0xff800000;
                  auVar48._20_4_ = 0xff800000;
                  auVar48._24_4_ = 0xff800000;
                  auVar48._28_4_ = 0xff800000;
                  auVar41 = vblendvps_avx(auVar48,*(undefined1 (*) [32])(local_15b0.ray + 0x100),
                                          auVar41);
                  *(undefined1 (*) [32])(local_15b0.ray + 0x100) = auVar41;
                }
                if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar10 >> 0x7f,0) != '\0') ||
                      (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar10 >> 0xbf,0) != '\0') ||
                    (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar10[0x1f] < '\0') goto LAB_0062b7d2;
                *(float *)(ray + k * 4 + 0x100) = fVar2;
              }
              uVar23 = uVar23 ^ 1L << (uVar15 & 0x3f);
            } while (uVar23 != 0);
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != uVar13 - 8);
    }
    auVar53 = ZEXT3264(local_1340);
    auVar57 = ZEXT3264(local_1360);
    auVar58 = ZEXT3264(local_1380);
    auVar62 = ZEXT3264(local_13a0);
    auVar67 = ZEXT3264(local_13c0);
    auVar71 = ZEXT3264(local_13e0);
    auVar77 = ZEXT3264(local_1400);
    auVar79 = ZEXT3264(local_1420);
joined_r0x0062b7ae:
    bVar11 = puVar26 != &local_1200;
    if (!bVar11) {
      return bVar11;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }